

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::GetTriHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  char *pcVar1;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar2;
  format_args args;
  writer write;
  string local_b8;
  writer local_98;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if ((short)(this->mBbrDataset).mPresentFlags < 0) {
    std::__cxx11::string::_M_assign((string *)aHostname);
  }
  else {
    local_68.types_[0] = none_type;
    from = "cannot find valid TRI Hostname in BBR Dataset";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot find valid TRI Hostname in BBR Dataset";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2d;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_98.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_00168374:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,from,to);
        from = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",&local_68);
        bVar2 = true;
      }
      else {
        to = from + 1;
        bVar2 = to != "";
        if (bVar2) {
          if (*to != '{') {
            pcVar1 = from + 2;
            do {
              to = pcVar1;
              bVar2 = to != "";
              if (to == "") goto LAB_00168370;
              pcVar1 = to + 1;
            } while (*to != '{');
          }
          bVar2 = true;
        }
LAB_00168370:
        if (bVar2) goto LAB_00168374;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,from,"");
        bVar2 = false;
      }
    } while (bVar2);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"cannot find valid TRI Hostname in BBR Dataset",
               (string_view)ZEXT816(0x2d),args);
    local_90 = kNotFound;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    __return_storage_ptr__->mCode = local_90;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetTriHostname(std::string &aHostname) const
{
    Error error;

    VerifyOrExit(mBbrDataset.mPresentFlags & BbrDataset::kTriHostnameBit,
                 error = ERROR_NOT_FOUND("cannot find valid TRI Hostname in BBR Dataset"));
    aHostname = mBbrDataset.mTriHostname;

exit:
    return error;
}